

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbopl.cpp
# Opt level: O0

void __thiscall DBOPL::Operator::UpdateRates(Operator *this,Chip *chip)

{
  byte local_19;
  Bit8u newKsr;
  Chip *chip_local;
  Operator *this_local;
  
  local_19 = (byte)(this->chanData >> 0x18);
  if ((this->reg20 & 0x10) == 0) {
    local_19 = (byte)((int)(uint)local_19 >> 2);
  }
  if (this->ksr != local_19) {
    this->ksr = local_19;
    UpdateAttack(this,chip);
    UpdateDecay(this,chip);
    UpdateRelease(this,chip);
  }
  return;
}

Assistant:

void Operator::UpdateRates( const Chip* chip ) {
	//Mame seems to reverse this where enabling ksr actually lowers
	//the rate, but pdf manuals says otherwise?
	Bit8u newKsr = (Bit8u)((chanData >> SHIFT_KEYCODE) & 0xff);
	if ( !( reg20 & MASK_KSR ) ) {
		newKsr >>= 2;
	}
	if ( ksr == newKsr )
		return;
	ksr = newKsr;
	UpdateAttack( chip );
	UpdateDecay( chip );
	UpdateRelease( chip );
}